

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void unique_ptr_test(void)

{
  pointer *ppuVar1;
  long lVar2;
  bool bVar3;
  Xxx *pXVar4;
  ostream *poVar5;
  unique_ptr<Xxx> *puVar6;
  reference pvVar7;
  long in_FS_OFFSET;
  unique_ptr<Xxx> local_60;
  undefined1 local_58 [8];
  vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> PtrList;
  vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> PtrVec;
  unique_ptr<Xxx> local_20;
  unique_ptr<Xxx> yPtr;
  unique_ptr<Xxx> xPtr;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  unique_ptr<Xxx>::unique_ptr(&yPtr);
  std::operator<<((ostream *)&std::cout,"unique_ptr_test: in\n");
  bVar3 = unique_ptr::operator_cast_to_bool((unique_ptr *)&yPtr);
  if (bVar3) {
    abort();
  }
  pXVar4 = (Xxx *)operator_new(0x10);
  Xxx::Xxx(pXVar4,0x400);
  unique_ptr<Xxx>::unique_ptr(&local_20,pXVar4);
  poVar5 = std::operator<<((ostream *)&std::cout,"yPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&local_20);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar3 = unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (!bVar3) {
    abort();
  }
  pXVar4 = unique_ptr<Xxx>::operator->(&local_20);
  Xxx::doSomething(pXVar4);
  puVar6 = move<unique_ptr<Xxx>>(&local_20);
  ppuVar1 = &PtrVec.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  unique_ptr<Xxx>::unique_ptr((unique_ptr<Xxx> *)ppuVar1,puVar6);
  unique_ptr<Xxx>::operator=(&yPtr,(unique_ptr<Xxx> *)ppuVar1);
  unique_ptr<Xxx>::~unique_ptr((unique_ptr<Xxx> *)ppuVar1);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"yPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&local_20);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  ppuVar1 = &PtrList.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::vector
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)ppuVar1);
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::push_back
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)ppuVar1,&yPtr);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)
             &PtrList.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  unique_ptr<Xxx>::~unique_ptr(&local_20);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::vector
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)local_58);
  puVar6 = move<unique_ptr<Xxx>>(&yPtr);
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::push_back
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)local_58,puVar6);
  poVar5 = std::operator<<((ostream *)&std::cout,"PtrList.back=");
  pvVar7 = std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::back
                     ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)local_58);
  pXVar4 = unique_ptr<Xxx>::get(pvVar7);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pvVar7 = std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::back
                     ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)local_58);
  unique_ptr<Xxx>::unique_ptr(&local_60,pvVar7);
  unique_ptr<Xxx>::operator=(&yPtr,&local_60);
  unique_ptr<Xxx>::~unique_ptr(&local_60);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector
            ((vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> *)local_58);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = unique_ptr<Xxx>::get(&yPtr);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"unique_ptr_test: out\n");
  unique_ptr<Xxx>::~unique_ptr(&yPtr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void unique_ptr_test(void)
{
    // Create an empty (ie. NULL) unique_ptr
    unique_ptr<Xxx> xPtr;

    std::cout << "unique_ptr_test: in\n";

    if (xPtr) // empty pointer
    {
        abort(); // impossible
    }
    else
    {
        // Create a new Xxx object, and give its ownership to the yPtr unique_ptr
        unique_ptr<Xxx> yPtr(new Xxx(1024));
        // Same as :
        //unique_ptr<Xxx> yPtr;
        //yPtr.reset(new Xxx(1024));

        std::cout << "yPtr=" << yPtr.get() << std::endl;
        if (yPtr) // valid pointer
        {
            // Access members functions/variables like with a raw pointer
            yPtr->doSomething();
        }
        else
        {
            abort(); // impossible
        }

        // Transfer ownership by making a copy of the unique_ptr
        xPtr = move(yPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;
        std::cout << "yPtr=" << yPtr.get() << std::endl;

        std::vector<unique_ptr<Xxx> > PtrVec;
        PtrVec.push_back(xPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;

    } // yPtr is destroyed, but xPtr retains the ownership of the object

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    {
        std::vector<unique_ptr<Xxx> > PtrList;
        PtrList.push_back(move(xPtr)); // Transfer ownership to the vector

        std::cout << "PtrList.back=" << PtrList.back().get() << std::endl;
        std::cout << "xPtr=" << xPtr.get() << std::endl;

        xPtr = PtrList.back(); // Get back ownership from the vector

        std::cout << "xPtr=" << xPtr.get() << std::endl;
    }

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    std::cout << "unique_ptr_test: out\n";

    // Same as :
    //xPtr.reset();
}